

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O0

UniquePtr<StyleSheet> __thiscall
Rml::StyleSheet::CombineStyleSheet(StyleSheet *this,StyleSheet *other_sheet)

{
  int iVar1;
  StyleSheet *this_00;
  pointer in_parent;
  pointer pSVar2;
  StyleSheet *in_RDX;
  undefined1 local_40 [40];
  StyleSheet *other_sheet_local;
  StyleSheet *this_local;
  UniquePtr<StyleSheet> *new_sheet;
  
  local_40[0x1f] = '\0';
  local_40._32_8_ = in_RDX;
  other_sheet_local = other_sheet;
  this_local = this;
  this_00 = (StyleSheet *)operator_new(0x1c0);
  StyleSheet(this_00);
  ::std::unique_ptr<Rml::StyleSheet,std::default_delete<Rml::StyleSheet>>::
  unique_ptr<std::default_delete<Rml::StyleSheet>,void>
            ((unique_ptr<Rml::StyleSheet,std::default_delete<Rml::StyleSheet>> *)this,this_00);
  in_parent = ::std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>::
              operator->(&other_sheet->root);
  StyleSheetNode::DeepCopy((StyleSheetNode *)local_40,in_parent);
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  ::std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>::operator=
            (&pSVar2->root,
             (unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_> *)local_40)
  ;
  ::std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>::~unique_ptr
            ((unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_> *)local_40)
  ;
  iVar1 = other_sheet->specificity_offset;
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  pSVar2->specificity_offset = iVar1;
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&pSVar2->keyframes,&other_sheet->keyframes);
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&pSVar2->named_decorator_map,&other_sheet->named_decorator_map);
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  SpritesheetList::operator=(&pSVar2->spritesheet_list,&other_sheet->spritesheet_list);
  pSVar2 = ::std::unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_>::operator->
                     ((unique_ptr<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>_> *)this);
  MergeStyleSheet(pSVar2,(StyleSheet *)local_40._32_8_);
  return (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)
         (__uniq_ptr_data<Rml::StyleSheet,_std::default_delete<Rml::StyleSheet>,_true,_true>)this;
}

Assistant:

UniquePtr<StyleSheet> StyleSheet::CombineStyleSheet(const StyleSheet& other_sheet) const
{
	RMLUI_ZoneScoped;

	UniquePtr<StyleSheet> new_sheet = UniquePtr<StyleSheet>(new StyleSheet());

	new_sheet->root = root->DeepCopy();
	new_sheet->specificity_offset = specificity_offset;
	new_sheet->keyframes = keyframes;
	new_sheet->named_decorator_map = named_decorator_map;
	new_sheet->spritesheet_list = spritesheet_list;

	new_sheet->MergeStyleSheet(other_sheet);

	return new_sheet;
}